

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blocksplitter.c
# Opt level: O0

void AddSorted(size_t value,size_t **out,size_t *outsize)

{
  ulong uVar1;
  ulong *in_RDX;
  long *in_RSI;
  ulong in_RDI;
  size_t j;
  size_t i;
  void *local_30;
  ulong local_28;
  ulong local_20;
  
  if ((*in_RDX & *in_RDX - 1) == 0) {
    if (*in_RDX == 0) {
      local_30 = malloc(8);
    }
    else {
      local_30 = realloc((void *)*in_RSI,*in_RDX << 4);
    }
    *in_RSI = (long)local_30;
  }
  *(ulong *)(*in_RSI + *in_RDX * 8) = in_RDI;
  *in_RDX = *in_RDX + 1;
  local_20 = 0;
  while( true ) {
    if (*in_RDX <= local_20 + 1) {
      return;
    }
    if (in_RDI < *(ulong *)(*in_RSI + local_20 * 8)) break;
    local_20 = local_20 + 1;
  }
  uVar1 = *in_RDX;
  while (local_28 = uVar1 - 1, local_20 < local_28) {
    *(undefined8 *)(*in_RSI + local_28 * 8) = *(undefined8 *)(*in_RSI + (uVar1 - 2) * 8);
    uVar1 = local_28;
  }
  *(ulong *)(*in_RSI + local_20 * 8) = in_RDI;
  return;
}

Assistant:

static void AddSorted(size_t value, size_t** out, size_t* outsize) {
  size_t i;
  ZOPFLI_APPEND_DATA(value, out, outsize);
  for (i = 0; i + 1 < *outsize; i++) {
    if ((*out)[i] > value) {
      size_t j;
      for (j = *outsize - 1; j > i; j--) {
        (*out)[j] = (*out)[j - 1];
      }
      (*out)[i] = value;
      break;
    }
  }
}